

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupOrpos(Aig_Man_t *p,int fAddRegs)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_58;
  int local_54;
  int local_3c;
  Aig_Obj_t *pAStack_38;
  int i;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int fAddRegs_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x450,"Aig_Man_t *Aig_ManDupOrpos(Aig_Man_t *, int)");
  }
  if (p->nConstrs < 1) {
    iVar1 = Aig_ManObjNumMax(p);
    p_local = Aig_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_local->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_local->pSpec = pcVar3;
    Aig_ManCleanData(p);
    pAVar4 = Aig_ManConst1(p_local);
    pAVar5 = Aig_ManConst1(p);
    (pAVar5->field_5).pData = pAVar4;
    for (local_3c = 0; iVar1 = Vec_PtrSize(p->vCis), local_3c < iVar1; local_3c = local_3c + 1) {
      pvVar6 = Vec_PtrEntry(p->vCis,local_3c);
      pAVar4 = Aig_ObjCreateCi(p_local);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    }
    if (fAddRegs == 0) {
      local_54 = 0;
    }
    else {
      local_54 = p->nRegs;
    }
    p_local->nRegs = local_54;
    if (fAddRegs == 0) {
      local_58 = p->nTruePis + p->nRegs;
    }
    else {
      local_58 = p->nTruePis;
    }
    p_local->nTruePis = local_58;
    p_local->nTruePos = 1;
    for (local_3c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_3c);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(p_local,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    pAStack_38 = Aig_ManConst0(p_local);
    local_3c = 0;
    while( true ) {
      iVar1 = Aig_ManCoNum(p);
      iVar2 = Aig_ManRegNum(p);
      if (iVar1 - iVar2 <= local_3c) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_3c);
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      pAStack_38 = Aig_Or(p_local,pAStack_38,pAVar4);
      local_3c = local_3c + 1;
    }
    Aig_ObjCreateCo(p_local,pAStack_38);
    if (fAddRegs != 0) {
      local_3c = Aig_ManCoNum(p);
      iVar1 = Aig_ManRegNum(p);
      for (local_3c = local_3c - iVar1; iVar1 = Vec_PtrSize(p->vCos), local_3c < iVar1;
          local_3c = local_3c + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_3c);
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        Aig_ObjCreateCo(p_local,pAVar4);
      }
    }
    Aig_ManCleanup(p_local);
  }
  else {
    printf("The AIG manager should have no constraints.\n");
    p_local = (Aig_Man_t *)0x0;
  }
  return p_local;
}

Assistant:

Aig_Man_t * Aig_ManDupOrpos( Aig_Man_t * p, int fAddRegs )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMiter;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    if ( p->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // set registers
    pNew->nRegs    = fAddRegs? p->nRegs : 0;
    pNew->nTruePis = fAddRegs? p->nTruePis : p->nTruePis + p->nRegs;
    pNew->nTruePos = 1;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create the PO
    pMiter = Aig_ManConst0(pNew);
    Aig_ManForEachPoSeq( p, pObj, i )
        pMiter = Aig_Or( pNew, pMiter, Aig_ObjChild0Copy(pObj) ); 
    Aig_ObjCreateCo( pNew, pMiter );
    // create register inputs with MUXes
    if ( fAddRegs )
    {
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}